

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

uint8_t __thiscall icu_63::Normalizer2Impl::getCC(Normalizer2Impl *this,uint16_t norm16)

{
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  if (norm16 < 0xfc00) {
    if ((norm16 < this->minNoNo) || (this->limitNoNo <= norm16)) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = getCCFromNoNo(this,norm16);
    }
  }
  else {
    this_local._7_1_ = getCCFromNormalYesOrMaybe(norm16);
  }
  return this_local._7_1_;
}

Assistant:

uint8_t getCC(uint16_t norm16) const {
        if(norm16>=MIN_NORMAL_MAYBE_YES) {
            return getCCFromNormalYesOrMaybe(norm16);
        }
        if(norm16<minNoNo || limitNoNo<=norm16) {
            return 0;
        }
        return getCCFromNoNo(norm16);
    }